

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

LIndex __thiscall PlanningUnitMADPDiscrete::GetNrJointPolicies(PlanningUnitMADPDiscrete *this)

{
  EOverflow *this_00;
  EOverflow *pEVar1;
  LIndex LVar2;
  char *arg;
  long *in_RDI;
  PlanningUnitMADPDiscrete *unaff_retaddr;
  LIndex nOld;
  Index ag;
  LIndex n;
  uint local_14;
  ulong local_10;
  long *plVar3;
  
  local_10 = 1;
  local_14 = 0;
  plVar3 = in_RDI;
  while( true ) {
    this_00 = (EOverflow *)(ulong)local_14;
    pEVar1 = (EOverflow *)(**(code **)(*in_RDI + 0x30))();
    if (pEVar1 <= this_00) {
      return local_10;
    }
    LVar2 = GetNrPolicies(unaff_retaddr,(Index)((ulong)plVar3 >> 0x20));
    if (LVar2 * local_10 < local_10) break;
    local_14 = local_14 + 1;
    local_10 = LVar2 * local_10;
  }
  arg = (char *)__cxa_allocate_exception(0x28);
  EOverflow::EOverflow(this_00,arg);
  __cxa_throw(arg,&EOverflow::typeinfo,EOverflow::~EOverflow);
}

Assistant:

LIndex PlanningUnitMADPDiscrete::GetNrJointPolicies() const
{
    LIndex n=1;
    for(Index ag=0; ag < GetNrAgents(); ag++)
    {
        LIndex nOld=n;
        n *= GetNrPolicies(ag);
        if(n<nOld)
            throw(EOverflow("PlanningUnitMADPDiscrete::GetNrJointPolicies() overflow detected"));
    }
    return(n);
}